

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,QStringBuilder<QLatin1String_&,_QString_&> *b)

{
  ArrayOptions *pAVar1;
  __atomic_base<int> _Var2;
  Data *pDVar3;
  QAbstractConcatenable *this;
  QChar *out;
  long lVar4;
  char16_t *pcVar5;
  long lVar6;
  char16_t *pcVar7;
  QLatin1StringView in;
  
  pDVar3 = (a->d).d;
  lVar4 = (a->d).size;
  lVar6 = b->a->m_size + lVar4 + (b->b->d).size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,lVar4,KeepSize);
  }
  pDVar3 = (a->d).d;
  if (pDVar3 == (Data *)0x0) {
    out = (QChar *)0x0;
  }
  else {
    out = (QChar *)((pDVar3->super_QArrayData).alloc -
                   (((long)((long)(a->d).ptr -
                           ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) &
                           0xfffffffffffffff0)) >> 1) + (a->d).size));
  }
  if ((long)out < lVar6) {
    if (pDVar3 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (pDVar3->super_QArrayData).alloc * 2;
    }
    if (lVar4 < lVar6) {
      lVar4 = lVar6;
    }
    if (((pDVar3 == (Data *)0x0) ||
        (_Var2._M_i = (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i,
        out = (QChar *)(ulong)(uint)_Var2._M_i, 1 < _Var2._M_i)) ||
       (out = (QChar *)((pDVar3->super_QArrayData).alloc -
                       ((long)((long)(a->d).ptr -
                              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) &
                              0xfffffffffffffff0)) >> 1)), (long)out <= lVar4)) {
      lVar6 = (a->d).size;
      if (lVar4 < lVar6) {
        lVar4 = lVar6;
      }
      QString::reallocData(a,lVar4,KeepSize);
    }
    pDVar3 = (a->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,(a->d).size,KeepSize);
  }
  pcVar7 = (a->d).ptr + (a->d).size;
  this = (QAbstractConcatenable *)b->a->m_size;
  in.m_data = (char *)pcVar7;
  in.m_size = (qsizetype)b->a->m_data;
  QAbstractConcatenable::appendLatin1To(this,in,out);
  lVar4 = (b->b->d).size;
  if (lVar4 != 0) {
    pcVar5 = (b->b->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = L"";
    }
    memcpy(pcVar7 + (long)this,pcVar5,lVar4 * 2);
  }
  pcVar5 = (a->d).ptr;
  if (pcVar5 == (char16_t *)0x0) {
    pcVar5 = L"";
  }
  QString::resize(a,(long)(pcVar7 + (long)this) + (lVar4 * 2 - (long)pcVar5) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}